

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O3

void __thiscall
TPZEqnArray<std::complex<long_double>_>::Print
          (TPZEqnArray<std::complex<long_double>_> *this,char *name,ostream *out)

{
  char cVar1;
  size_t sVar2;
  int *piVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  cVar1 = (char)out;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  uVar5 = (ulong)(uint)this->fNumEq;
  if (0 < this->fNumEq) {
    uVar6 = 0;
    do {
      if (uVar6 == (int)uVar5 - 1) {
        iVar8 = (int)(this->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                     super_TPZVec<std::complex<long_double>_>.fNElements;
        piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
      }
      else {
        piVar3 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore;
        iVar8 = piVar3[uVar6 + 1];
      }
      iVar9 = piVar3[uVar6];
      lVar7 = (long)iVar9;
      if (iVar9 < iVar8) {
        iVar9 = iVar8 - iVar9;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(out,"col = ",6);
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             (out,(this->fIndex).super_TPZManVector<int,_1000>.super_TPZVec<int>.
                                  fStore[lVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"   ",3);
          lVar7 = lVar7 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      iVar9 = (this->fEqStart).super_TPZManVector<int,_100>.super_TPZVec<int>.fStore[uVar6];
      if (iVar9 < iVar8) {
        lVar7 = (long)iVar9 << 5;
        iVar8 = iVar8 - iVar9;
        do {
          poVar4 = std::operator<<(out,(complex *)
                                       (((this->fEqValues).
                                         super_TPZManVector<std::complex<long_double>,_1000>.
                                         super_TPZVec<std::complex<long_double>_>.fStore)->_M_value
                                       + lVar7));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  ",2);
          lVar7 = lVar7 + 0x20;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      uVar6 = uVar6 + 1;
      uVar5 = (ulong)this->fNumEq;
    } while ((long)uVar6 < (long)uVar5);
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::Print(const char *name, std::ostream& out)
{
	if(name) out << name << endl;
	int i,j;
	for(i=0;i<fNumEq;i++){
		int aux_limit;
		
		if(i==fNumEq-1){
			aux_limit=fEqValues.NElements();
		}else aux_limit=fEqStart[i+1];
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << "col = " << fIndex[j] << "   ";
		}
		out << endl;
		for(j=fEqStart[i]; j<aux_limit ; j++) {
			out << fEqValues[j] << "  ";
		}
		out << endl;
		out << endl;
	}
}